

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void fftBRInit(long M,short *BRLow)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar6;
  
  uVar3 = M / 2;
  if (uVar3 - 1 != 0x3f) {
    uVar1 = 1L << (uVar3 - 1 & 0x3f);
    uVar2 = 2;
    if (2 < (long)uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = 1;
    if (1 < (long)uVar1) {
      uVar3 = uVar1;
    }
    uVar4 = 0;
    do {
      if (M < 4) {
        sVar5 = 0;
      }
      else {
        uVar7 = 1;
        uVar8 = 1;
        lVar6 = 0;
        do {
          lVar9 = (long)uVar1 >> (uVar7 & 0x3f);
          if ((uVar8 & uVar4) == 0) {
            lVar9 = 0;
          }
          lVar6 = lVar6 + lVar9;
          sVar5 = (short)lVar6;
          uVar8 = uVar8 * 2;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      BRLow[uVar4] = sVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void fftBRInit(long M, short *BRLow){
/* Compute BRLow, the bit reversed table for ffts	*/
/* of size pow(2,M/2 -1)	*/
/* INPUTS */
/* M = log2 of fft size	*/
/* OUTPUTS */
/* *BRLow = bit reversed counter table	*/
long	Mroot_1 = M / 2 - 1;
long	Nroot_1 = POW2(Mroot_1);
long i1;
long bitsum;
long bitmask;
long bit;
for (i1 = 0; i1 < Nroot_1; i1++){
	bitsum = 0;
	bitmask = 1;
	for (bit=1; bit <= Mroot_1; bitmask<<=1, bit++)
		if (i1 & bitmask)
			bitsum = bitsum + (Nroot_1 >> bit);
	BRLow[i1] = bitsum;
};
}